

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O3

bool __thiscall cmGetPropertyCommand::StoreResult(cmGetPropertyCommand *this,char *value)

{
  cmMakefile *this_00;
  bool bVar1;
  
  if (this->InfoType == OutSet) {
    this_00 = (this->super_cmCommand).Makefile;
    bVar1 = value == (char *)0x0;
    value = "1";
    if (bVar1) {
      value = "0";
    }
  }
  else {
    this_00 = (this->super_cmCommand).Makefile;
    if (value == (char *)0x0) {
      cmMakefile::RemoveDefinition(this_00,&this->Variable);
      return true;
    }
  }
  cmMakefile::AddDefinition(this_00,&this->Variable,value);
  return true;
}

Assistant:

bool cmGetPropertyCommand::StoreResult(const char* value)
{
  if(this->InfoType == OutSet)
    {
    this->Makefile->AddDefinition(this->Variable, value? "1":"0");
    }
  else // if(this->InfoType == OutValue)
    {
    if(value)
      {
      this->Makefile->AddDefinition(this->Variable, value);
      }
    else
      {
      this->Makefile->RemoveDefinition(this->Variable);
      }
    }
  return true;
}